

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void JX9_TIME_Const(jx9_value *pVal,void *pUnused)

{
  tm *ptVar1;
  time_t t;
  time_t tStack_18;
  
  time(&tStack_18);
  ptVar1 = gmtime(&tStack_18);
  jx9_value_string_format
            (pVal,"%02d:%02d:%02d",(ulong)(uint)ptVar1->tm_hour,(ulong)(uint)ptVar1->tm_min,
             (ulong)(uint)ptVar1->tm_sec);
  return;
}

Assistant:

static void JX9_TIME_Const(jx9_value *pVal, void *pUnused)
{
	Sytm sTm;
#ifdef __WINNT__
	SYSTEMTIME sOS;
	GetSystemTime(&sOS);
	SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
	struct tm *pTm;
	time_t t;
	time(&t);
	pTm = gmtime(&t);
	STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	SXUNUSED(pUnused); /* cc warning */
	/* Expand */
	jx9_value_string_format(pVal, "%02d:%02d:%02d", sTm.tm_hour, sTm.tm_min, sTm.tm_sec);
}